

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

OPENSSL_STACK * OPENSSL_sk_dup(OPENSSL_STACK *sk)

{
  void **ppvVar1;
  OPENSSL_STACK *ret;
  OPENSSL_STACK *sk_local;
  
  if (sk == (OPENSSL_STACK *)0x0) {
    sk_local = (OPENSSL_STACK *)0x0;
  }
  else {
    sk_local = (OPENSSL_STACK *)OPENSSL_zalloc(0x28);
    if (sk_local == (OPENSSL_STACK *)0x0) {
      sk_local = (OPENSSL_STACK *)0x0;
    }
    else {
      ppvVar1 = (void **)OPENSSL_memdup(sk->data,sk->num_alloc << 3);
      sk_local->data = ppvVar1;
      if (sk_local->data == (void **)0x0) {
        OPENSSL_sk_free(sk_local);
        sk_local = (OPENSSL_STACK *)0x0;
      }
      else {
        sk_local->num = sk->num;
        sk_local->sorted = sk->sorted;
        sk_local->num_alloc = sk->num_alloc;
        sk_local->comp = sk->comp;
      }
    }
  }
  return sk_local;
}

Assistant:

OPENSSL_STACK *OPENSSL_sk_dup(const OPENSSL_STACK *sk) {
  if (sk == NULL) {
    return NULL;
  }

  OPENSSL_STACK *ret =
      reinterpret_cast<OPENSSL_STACK *>(OPENSSL_zalloc(sizeof(OPENSSL_STACK)));
  if (ret == NULL) {
    return NULL;
  }

  ret->data = reinterpret_cast<void **>(
      OPENSSL_memdup(sk->data, sizeof(void *) * sk->num_alloc));
  if (ret->data == NULL) {
    goto err;
  }

  ret->num = sk->num;
  ret->sorted = sk->sorted;
  ret->num_alloc = sk->num_alloc;
  ret->comp = sk->comp;
  return ret;

err:
  OPENSSL_sk_free(ret);
  return NULL;
}